

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O2

void __thiscall
GdlBinaryExpression::GdlBinaryExpression(GdlBinaryExpression *this,GdlBinaryExpression *exp)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  GdlExpression::GdlExpression(&this->super_GdlExpression,&exp->super_GdlExpression);
  (this->super_GdlExpression)._vptr_GdlExpression = (_func_int **)&PTR_Clone_00212430;
  this->m_psymOperator = exp->m_psymOperator;
  iVar1 = (**exp->m_pexpOperand1->_vptr_GdlExpression)();
  this->m_pexpOperand1 = (GdlExpression *)CONCAT44(extraout_var,iVar1);
  iVar1 = (**exp->m_pexpOperand2->_vptr_GdlExpression)();
  this->m_pexpOperand2 = (GdlExpression *)CONCAT44(extraout_var_00,iVar1);
  return;
}

Assistant:

GdlBinaryExpression(const GdlBinaryExpression & exp)
		:	GdlExpression(exp),
			m_psymOperator(exp.m_psymOperator),
			m_pexpOperand1(exp.m_pexpOperand1->Clone()),
			m_pexpOperand2(exp.m_pexpOperand2->Clone())
	{
	}